

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableWidget::setItem(QTableWidget *this,int row,int column,QTableWidgetItem *item)

{
  QTableModel *this_00;
  QTableWidgetItem *pQVar1;
  
  if (item == (QTableWidgetItem *)0x0) {
    pQVar1 = takeItem(this,row,column);
    if (pQVar1 != (QTableWidgetItem *)0x0) {
      (*pQVar1->_vptr_QTableWidgetItem[1])(pQVar1);
      return;
    }
  }
  else {
    if (item->view == (QTableWidget *)0x0) {
      item->view = this;
      this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      QTableModel::setItem(this_00,row,column,item);
      return;
    }
    setItem();
  }
  return;
}

Assistant:

void QTableWidget::setItem(int row, int column, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        if (Q_UNLIKELY(item->view)) {
            qWarning("QTableWidget: cannot insert an item that is already owned by another QTableWidget");
        } else {
            item->view = this;
            d->tableModel()->setItem(row, column, item);
        }
    } else {
        delete takeItem(row, column);
    }
}